

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiID IVar1;
  ImGuiDockNodeSettings *pIVar2;
  char *pcVar3;
  ImGuiDockContextPruneNodeData *pIVar4;
  ImGuiWindowSettings *pIVar5;
  ImGuiDockContextPruneNodeData *pIVar6;
  byte bVar7;
  ImGuiID *pIVar8;
  int iVar9;
  long lVar10;
  ImGuiID *pIVar11;
  long lVar12;
  ImChunkStream<ImGuiWindowSettings> *this;
  bool bVar13;
  bool bVar14;
  ImPool<ImGuiDockContextPruneNodeData> local_58;
  
  if ((ctx->Windows).Size == 0) {
    local_58.Map.Data.Size = 0;
    local_58.Map.Data.Capacity = 0;
    local_58.Map.Data.Data = (ImGuiStoragePair *)0x0;
    local_58.Buf.Size = 0;
    local_58.Buf.Capacity = 0;
    local_58.Buf.Data = (ImGuiDockContextPruneNodeData *)0x0;
    local_58.FreeIdx = 0;
    ImPool<ImGuiDockContextPruneNodeData>::Reserve(&local_58,(ctx->DockContext).NodesSettings.Size);
    if (0 < (ctx->DockContext).NodesSettings.Size) {
      lVar12 = 0;
      lVar10 = 0;
      do {
        pIVar2 = (ctx->DockContext).NodesSettings.Data;
        IVar1 = *(ImGuiID *)((long)&pIVar2->ParentNodeId + lVar12);
        if (IVar1 == 0) {
          pIVar4 = (ImGuiDockContextPruneNodeData *)0x0;
        }
        else {
          pIVar4 = ImPool<ImGuiDockContextPruneNodeData>::GetByKey(&local_58,IVar1);
        }
        pIVar11 = (ImGuiID *)((long)&pIVar2->ID + lVar12);
        pIVar8 = &pIVar4->RootId;
        if (pIVar4 == (ImGuiDockContextPruneNodeData *)0x0) {
          pIVar8 = pIVar11;
        }
        IVar1 = *pIVar8;
        pIVar4 = ImPool<ImGuiDockContextPruneNodeData>::GetOrAddByKey(&local_58,*pIVar11);
        pIVar4->RootId = IVar1;
        if (pIVar11[1] != 0) {
          pIVar4 = ImPool<ImGuiDockContextPruneNodeData>::GetOrAddByKey(&local_58,pIVar11[1]);
          pIVar4->CountChildNodes = pIVar4->CountChildNodes + 1;
        }
        lVar10 = lVar10 + 1;
        lVar12 = lVar12 + 0x24;
      } while (lVar10 < (ctx->DockContext).NodesSettings.Size);
    }
    if (0 < (ctx->DockContext).NodesSettings.Size) {
      lVar12 = 8;
      lVar10 = 0;
      do {
        IVar1 = *(ImGuiID *)((long)&((ctx->DockContext).NodesSettings.Data)->ID + lVar12);
        if ((((IVar1 != 0) &&
             (pIVar5 = FindWindowSettings(IVar1), pIVar5 != (ImGuiWindowSettings *)0x0)) &&
            (pIVar5->DockId != 0)) &&
           (pIVar4 = ImPool<ImGuiDockContextPruneNodeData>::GetByKey(&local_58,pIVar5->DockId),
           pIVar4 != (ImGuiDockContextPruneNodeData *)0x0)) {
          pIVar4->CountChildNodes = pIVar4->CountChildNodes + 1;
        }
        lVar10 = lVar10 + 1;
        lVar12 = lVar12 + 0x24;
      } while (lVar10 < (ctx->DockContext).NodesSettings.Size);
    }
    pIVar5 = (ImGuiWindowSettings *)(ctx->SettingsWindows).Buf.Data;
    if (pIVar5 != (ImGuiWindowSettings *)0x0) {
      pIVar5 = (ImGuiWindowSettings *)&pIVar5->Pos;
    }
    for (; pIVar5 != (ImGuiWindowSettings *)0x0;
        pIVar5 = ImChunkStream<ImGuiWindowSettings>::next_chunk(&ctx->SettingsWindows,pIVar5)) {
      IVar1 = pIVar5->DockId;
      if ((IVar1 != 0) &&
         (pIVar4 = ImPool<ImGuiDockContextPruneNodeData>::GetByKey(&local_58,IVar1),
         pIVar4 != (ImGuiDockContextPruneNodeData *)0x0)) {
        pIVar4->CountWindows = pIVar4->CountWindows + 1;
        if (pIVar4->RootId != IVar1) {
          pIVar4 = ImPool<ImGuiDockContextPruneNodeData>::GetByKey(&local_58,pIVar4->RootId);
        }
        if (pIVar4 != (ImGuiDockContextPruneNodeData *)0x0) {
          pIVar4->CountChildWindows = pIVar4->CountChildWindows + 1;
        }
      }
    }
    if (0 < (ctx->DockContext).NodesSettings.Size) {
      lVar10 = 0;
      do {
        pIVar2 = (ctx->DockContext).NodesSettings.Data;
        pIVar4 = ImPool<ImGuiDockContextPruneNodeData>::GetByKey(&local_58,pIVar2[lVar10].ID);
        if (pIVar4->CountWindows < 2) {
          pIVar2 = pIVar2 + lVar10;
          pIVar6 = pIVar4;
          if (pIVar4->RootId != pIVar2->ID) {
            pIVar6 = ImPool<ImGuiDockContextPruneNodeData>::GetByKey(&local_58,pIVar4->RootId);
          }
          bVar14 = false;
          bVar13 = false;
          if ((pIVar4->CountWindows == 1 && pIVar2->ParentNodeId == 0) &&
             (pIVar4->CountChildNodes == 0)) {
            bVar13 = (pIVar2->Flags & 0x800) == 0;
          }
          if (pIVar4->CountWindows == 0 && pIVar2->ParentNodeId == 0) {
            bVar14 = pIVar4->CountChildNodes == 0;
          }
          if ((bVar14 || bVar13) || (pIVar6->CountChildWindows == 0)) {
            pcVar3 = (GImGui->SettingsWindows).Buf.Data;
            if (pcVar3 != (char *)0x0) {
              this = &GImGui->SettingsWindows;
              pIVar5 = (ImGuiWindowSettings *)(pcVar3 + 4);
              iVar9 = 0;
              do {
                bVar7 = 1;
                if (pIVar5->DockId == pIVar2->ID) {
                  pIVar5->DockId = 0;
                  pIVar5->DockOrder = -1;
                  bVar7 = (byte)((uint)iVar9 >> 0x1f);
                  iVar9 = iVar9 + 1;
                }
              } while ((bVar7 != 0) &&
                      (pIVar5 = ImChunkStream<ImGuiWindowSettings>::next_chunk(this,pIVar5),
                      pIVar5 != (ImGuiWindowSettings *)0x0));
            }
            pIVar2->ID = 0;
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < (ctx->DockContext).NodesSettings.Size);
    }
    ImPool<ImGuiDockContextPruneNodeData>::~ImPool(&local_58);
  }
  DockContextBuildNodesFromSettings
            (ctx,(ctx->DockContext).NodesSettings.Data,(ctx->DockContext).NodesSettings.Size);
  DockContextBuildAddWindowsToNodes(ctx,0);
  return;
}

Assistant:

static void ImGui::DockSettingsHandler_ApplyAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    // Prune settings at boot time only
    ImGuiDockContext* dc  = &ctx->DockContext;
    if (ctx->Windows.Size == 0)
        DockContextPruneUnusedSettingsNodes(ctx);
    DockContextBuildNodesFromSettings(ctx, dc->NodesSettings.Data, dc->NodesSettings.Size);
    DockContextBuildAddWindowsToNodes(ctx, 0);
}